

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_yang.c
# Opt level: O2

lys_module * yang_read_module(ly_ctx *ctx,char *data,uint size,char *revision,int implement)

{
  LY_ERR LVar1;
  int iVar2;
  int iVar3;
  unres_schema *unres;
  lys_module *module;
  LY_ERR *pLVar4;
  LY_VECODE *pLVar5;
  lys_module *plVar6;
  lys_node *local_50;
  lys_node *node;
  char *local_40;
  unres_schema *local_38;
  
  local_50 = (lys_node *)0x0;
  node = (lys_node *)ctx;
  unres = (unres_schema *)calloc(1,0x28);
  local_38 = unres;
  if ((unres == (unres_schema *)0x0) ||
     (local_40 = revision, module = (lys_module *)calloc(1,0xb0), module == (lys_module *)0x0)) {
    pLVar4 = ly_errno_location();
    *pLVar4 = LY_EMEM;
    module = (lys_module *)0x0;
    ly_log(LY_LLERR,"Memory allocation failed (%s()).","yang_read_module");
  }
  else {
    module->ctx = (ly_ctx *)node;
    module->field_0x40 = (implement != 0) << 7;
    iVar2 = lyp_check_circmod_add(module);
    if (iVar2 == 0) {
      iVar2 = yang_parse_mem(module,(lys_submodule *)0x0,unres,data,size,&local_50);
      if (iVar2 == 1) {
        if (local_38->count != 0) {
          __assert_fail("!unres->count",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/parser_yang.c"
                        ,0xa42,
                        "struct lys_module *yang_read_module(struct ly_ctx *, const char *, unsigned int, const char *, int)"
                       );
        }
      }
      else {
        if (iVar2 == -1) {
          free_yang_common(module,local_50);
          goto LAB_0014bb0a;
        }
        iVar3 = yang_check_sub_module(module,local_38,local_50);
        if ((iVar3 != 0) ||
           ((local_38->count != 0 && (iVar3 = resolve_unres_schema(module,local_38), iVar3 != 0))))
        goto LAB_0014bb0a;
      }
      lyp_sort_revisions(module);
      if ((local_40 == (char *)0x0) ||
         ((module->rev_size != '\0' && (iVar3 = strcmp(local_40,module->rev->date), iVar3 == 0)))) {
        if (iVar2 != 0) {
          plVar6 = ly_ctx_get_module((ly_ctx *)node,module->name,local_40);
          if (plVar6 == (lys_module *)0x0) {
            __assert_fail("module",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/parser_yang.c"
                          ,0xa78,
                          "struct lys_module *yang_read_module(struct ly_ctx *, const char *, unsigned int, const char *, int)"
                         );
          }
          lys_free(module,(_func_void_lys_node_ptr_void_ptr *)0x0,0);
          module = plVar6;
          goto LAB_0014bc9d;
        }
        iVar2 = lyp_check_include_missing(module);
        if (iVar2 == 0) {
          lyp_del_includedup(module);
          iVar2 = lyp_rfn_apply_ext(module);
          if (((iVar2 == 0) && (iVar2 = lyp_deviation_apply_ext(module), iVar2 == 0)) &&
             (iVar2 = lyp_ctx_add_module(module), iVar2 == 0)) {
            if ((module->deviation_size != '\0') && (-1 < (char)module->field_0x40)) {
              if ('\x01' < ly_log_level) {
                ly_log(LY_LLVRB,
                       "Module \"%s\" includes deviations, changing its conformance to \"implement\"."
                       ,module->name);
              }
              iVar2 = lys_set_implemented(module);
              if (iVar2 != 0) goto LAB_0014bb0a;
            }
LAB_0014bc9d:
            unres_schema_free((lys_module *)0x0,&local_38);
            lyp_check_circmod_pop((ly_ctx *)node);
            if (ly_log_level < '\x02') {
              return module;
            }
            ly_log(LY_LLVRB,"Module \"%s\" successfully parsed.",module->name);
            return module;
          }
        }
      }
      else if ('\x01' < ly_log_level) {
        ly_log(LY_LLVRB,"Module \"%s\" parsed with the wrong revision (\"%s\" instead \"%s\").",
               module->name,module->rev,local_40);
      }
    }
  }
LAB_0014bb0a:
  unres_schema_free(module,&local_38);
  if ((module == (lys_module *)0x0) || (module->name == (char *)0x0)) {
    free(module);
    pLVar5 = ly_vecode_location();
    if (*pLVar5 != LYVE_SUBMODULE) {
      pLVar4 = ly_errno_location();
      if (*pLVar4 != LY_SUCCESS) {
        pLVar4 = ly_errno_location();
        LVar1 = *pLVar4;
        pLVar4 = ly_errno_location();
        *pLVar4 = LVar1;
      }
      ly_log(LY_LLERR,"Module parsing failed.");
      return (lys_module *)0x0;
    }
  }
  else {
    pLVar4 = ly_errno_location();
    if (*pLVar4 != LY_SUCCESS) {
      pLVar4 = ly_errno_location();
      LVar1 = *pLVar4;
      pLVar4 = ly_errno_location();
      *pLVar4 = LVar1;
    }
    ly_log(LY_LLERR,"Module \"%s\" parsing failed.",module->name);
    lyp_check_circmod_pop((ly_ctx *)node);
    lyp_del_includedup(module);
    lys_sub_module_remove_devs_augs(module);
    lys_free(module,(_func_void_lys_node_ptr_void_ptr *)0x0,1);
  }
  return (lys_module *)0x0;
}

Assistant:

struct lys_module *
yang_read_module(struct ly_ctx *ctx, const char* data, unsigned int size, const char *revision, int implement)
{

    struct lys_module *module = NULL, *tmp_mod;
    struct unres_schema *unres = NULL;
    struct lys_node *node = NULL;
    int ret;

    unres = calloc(1, sizeof *unres);
    if (!unres) {
        LOGMEM;
        goto error;
    }

    module = calloc(1, sizeof *module);
    if (!module) {
        LOGMEM;
        goto error;
    }

    /* initiale module */
    module->ctx = ctx;
    module->type = 0;
    module->implemented = (implement ? 1 : 0);

    /* add into the list of processed modules */
    if (lyp_check_circmod_add(module)) {
        goto error;
    }

    ret = yang_parse_mem(module, NULL, unres, data, size, &node);
    if (ret == -1) {
        free_yang_common(module, node);
        goto error;
    } else if (ret == 1) {
        assert(!unres->count);
    } else {
        if (yang_check_sub_module(module, unres, node)) {
            goto error;
        }

        if (unres->count && resolve_unres_schema(module, unres)) {
            goto error;
        }
    }

    lyp_sort_revisions(module);

    if (revision) {
        /* check revision of the parsed model */
        if (!module->rev_size || strcmp(revision, module->rev[0].date)) {
            LOGVRB("Module \"%s\" parsed with the wrong revision (\"%s\" instead \"%s\").",
                   module->name, module->rev[0].date, revision);
            goto error;
        }
    }

    /* add into context if not already there */
    if (!ret) {
        /* check correctness of includes */
        if (lyp_check_include_missing(module)) {
            goto error;
        }

        /* remove our submodules from the parsed submodules list */
        lyp_del_includedup(module);


        if (lyp_rfn_apply_ext(module) || lyp_deviation_apply_ext(module)) {
            goto error;
        }

        if (lyp_ctx_add_module(module)) {
            goto error;
        }

        if (module->deviation_size && !module->implemented) {
            LOGVRB("Module \"%s\" includes deviations, changing its conformance to \"implement\".", module->name);
            /* deviations always causes target to be made implemented,
             * but augents and leafrefs not, so we have to apply them now */
            if (lys_set_implemented(module)) {
                goto error;
            }
        }
    } else {
        tmp_mod = module;

        /* get the model from the context */
        module = (struct lys_module *)ly_ctx_get_module(ctx, module->name, revision);
        assert(module);

        /* free what was parsed */
        lys_free(tmp_mod, NULL, 0);
    }

    unres_schema_free(NULL, &unres);
    lyp_check_circmod_pop(ctx);
    LOGVRB("Module \"%s\" successfully parsed.", module->name);
    return module;

error:
    /* cleanup */
    unres_schema_free(module, &unres);
    if (!module || !module->name) {
        free(module);
        if (ly_vecode != LYVE_SUBMODULE) {
            LOGERR(ly_errno, "Module parsing failed.");
        }
        return NULL;
    }

    LOGERR(ly_errno, "Module \"%s\" parsing failed.", module->name);

    lyp_check_circmod_pop(ctx);
    lyp_del_includedup(module);
    lys_sub_module_remove_devs_augs(module);
    lys_free(module, NULL, 1);
    return NULL;
}